

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffverifydate(int year,int month,int day,int *status)

{
  char local_b8 [8];
  char errmsg [81];
  int local_58 [2];
  int ndays [13];
  int *status_local;
  int day_local;
  int month_local;
  int year_local;
  
  unique0x1000024c = status;
  memcpy(local_58,&DAT_0029f690,0x34);
  if ((year < 0) || (9999 < year)) {
    snprintf(local_b8,0x51,"input year value = %d is out of range 0 - 9999",(ulong)(uint)year);
    ffpmsg(local_b8);
    *stack0xffffffffffffffe0 = 0x1a4;
    month_local = 0x1a4;
  }
  else if ((month < 1) || (0xc < month)) {
    snprintf(local_b8,0x51,"input month value = %d is out of range 1 - 12",(ulong)(uint)month);
    ffpmsg(local_b8);
    *stack0xffffffffffffffe0 = 0x1a4;
    month_local = 0x1a4;
  }
  else {
    if (ndays[(long)month + -2] == 0x1f) {
      if ((day < 1) || (0x1f < day)) {
        snprintf(local_b8,0x51,"input day value = %d is out of range 1 - 31 for month %d",
                 (ulong)(uint)day,(ulong)(uint)month);
        ffpmsg(local_b8);
        *stack0xffffffffffffffe0 = 0x1a4;
        return 0x1a4;
      }
    }
    else if (ndays[(long)month + -2] == 0x1e) {
      if ((day < 1) || (0x1e < day)) {
        snprintf(local_b8,0x51,"input day value = %d is out of range 1 - 30 for month %d",
                 (ulong)(uint)day,(ulong)(uint)month);
        ffpmsg(local_b8);
        *stack0xffffffffffffffe0 = 0x1a4;
        return 0x1a4;
      }
    }
    else if ((day < 1) || (0x1c < day)) {
      if (day == 0x1d) {
        if (((year % 4 == 0) && (year % 100 != 0)) || (year % 400 == 0)) {
          return *stack0xffffffffffffffe0;
        }
        snprintf(local_b8,0x51,
                 "input day value = %d is out of range 1 - 28 for February %d (not leap year)",0x1d,
                 (ulong)(uint)year);
        ffpmsg(local_b8);
      }
      else {
        snprintf(local_b8,0x51,"input day value = %d is out of range 1 - 28 (or 29) for February",
                 (ulong)(uint)day);
        ffpmsg(local_b8);
      }
      *stack0xffffffffffffffe0 = 0x1a4;
      return 0x1a4;
    }
    month_local = *stack0xffffffffffffffe0;
  }
  return month_local;
}

Assistant:

int ffverifydate(int year,          /* I - year (0 - 9999)           */
                 int month,         /* I - month (1 - 12)            */
                 int day,           /* I - day (1 - 31)              */
                 int   *status)     /* IO - error status             */
/*
  Verify that the date is valid
*/
{
    int ndays[] = {0,31,28,31,30,31,30,31,31,30,31,30,31};
    char errmsg[FLEN_ERRMSG];
    

    if (year < 0 || year > 9999)
    {
       snprintf(errmsg, FLEN_ERRMSG,
       "input year value = %d is out of range 0 - 9999", year);
       ffpmsg(errmsg);
       return(*status = BAD_DATE);
    }
    else if (month < 1 || month > 12)
    {
       snprintf(errmsg, FLEN_ERRMSG,
       "input month value = %d is out of range 1 - 12", month);
       ffpmsg(errmsg);
       return(*status = BAD_DATE);
    }
    
    if (ndays[month] == 31) {
        if (day < 1 || day > 31)
        {
           snprintf(errmsg, FLEN_ERRMSG,
           "input day value = %d is out of range 1 - 31 for month %d", day, month);
           ffpmsg(errmsg);
           return(*status = BAD_DATE);
        }
    } else if (ndays[month] == 30) {
        if (day < 1 || day > 30)
        {
           snprintf(errmsg, FLEN_ERRMSG,
           "input day value = %d is out of range 1 - 30 for month %d", day, month);
           ffpmsg(errmsg);
           return(*status = BAD_DATE);
        }
    } else {
        if (day < 1 || day > 28)
        {
            if (day == 29)
            {
	      /* year is a leap year if it is divisible by 4 but not by 100,
	         except years divisible by 400 are leap years
	      */
	        if ((year % 4 == 0 && year % 100 != 0 ) || year % 400 == 0)
		   return (*status);
		   
 	        snprintf(errmsg, FLEN_ERRMSG,
           "input day value = %d is out of range 1 - 28 for February %d (not leap year)", day, year);
                ffpmsg(errmsg);
	    } else {
                snprintf(errmsg, FLEN_ERRMSG,
                "input day value = %d is out of range 1 - 28 (or 29) for February", day);
                ffpmsg(errmsg);
	    }
	    
            return(*status = BAD_DATE);
        }
    }
    return(*status);
}